

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O3

uint32_t __thiscall spvtools::opt::MemPass::Type2Undef(MemPass *this,uint32_t type_id)

{
  IRContext *this_00;
  uint32_t res_id;
  iterator iVar1;
  Instruction *this_01;
  mapped_type *pmVar2;
  uint32_t local_4c;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  local_4c = type_id;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->type2undefs_)._M_h,&local_4c);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    res_id = Pass::TakeNextId(&this->super_Pass);
    if (res_id == 0) {
      res_id = 0;
    }
    else {
      this_01 = (Instruction *)operator_new(0x70);
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Instruction::Instruction
                (this_01,(this->super_Pass).context_,OpUndef,local_4c,res_id,&local_48);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_48);
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      analysis::DefUseManager::AnalyzeInstDefUse
                ((this_00->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,this_01);
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(((((this->super_Pass).context_)->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                  types_values_).super_IntrusiveList<spvtools::opt::Instruction>,this_01);
      pmVar2 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->type2undefs_,&local_4c);
      *pmVar2 = res_id;
    }
  }
  else {
    res_id = *(uint32_t *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                     _M_cur + 0xc);
  }
  return res_id;
}

Assistant:

uint32_t MemPass::Type2Undef(uint32_t type_id) {
  const auto uitr = type2undefs_.find(type_id);
  if (uitr != type2undefs_.end()) return uitr->second;
  const uint32_t undefId = TakeNextId();
  if (undefId == 0) {
    return 0;
  }

  std::unique_ptr<Instruction> undef_inst(
      new Instruction(context(), spv::Op::OpUndef, type_id, undefId, {}));
  get_def_use_mgr()->AnalyzeInstDefUse(&*undef_inst);
  get_module()->AddGlobalValue(std::move(undef_inst));
  type2undefs_[type_id] = undefId;
  return undefId;
}